

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_appender.cpp
# Opt level: O2

ArrowArray *
duckdb::ArrowAppender::FinalizeChild
          (LogicalType *type,
          unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
          *append_data_p)

{
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> _Var1;
  data_ptr_t pdVar2;
  _Head_base<0UL,_ArrowArray_*,_false> _Var3;
  ArrowArray *in_RAX;
  type this;
  pointer pAVar4;
  long lVar5;
  ArrowBuffer *pAVar6;
  templated_unique_single_t result;
  _Head_base<0UL,_ArrowArray_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  make_uniq<ArrowArray>();
  this = unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
         operator*(append_data_p);
  _Var1._M_head_impl =
       (append_data_p->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (append_data_p->
  super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->private_data = _Var1._M_head_impl;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->release = ReleaseArray;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->n_children = 0;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->null_count = 0;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->offset = 0;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->dictionary = (ArrowArray *)0x0;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->buffers = (this->buffers)._M_elems;
  lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(this->null_count);
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->null_count = lVar5;
  lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(this->row_count);
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  pAVar4->length = lVar5;
  pAVar6 = ArrowAppendData::GetValidityBuffer(this);
  pdVar2 = pAVar6->dataptr;
  pAVar4 = unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true>::operator->
                     ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>,_true> *)&local_28);
  *pAVar4->buffers = pdVar2;
  if (this->finalize != (finalize_t)0x0) {
    (*this->finalize)(this,type,local_28._M_head_impl);
  }
  _Var3._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (ArrowArray *)0x0;
  ::std::__uniq_ptr_impl<ArrowArray,_std::default_delete<ArrowArray>_>::reset
            ((__uniq_ptr_impl<ArrowArray,_std::default_delete<ArrowArray>_> *)&this->array,
             _Var3._M_head_impl);
  _Var3._M_head_impl =
       (this->array).super_unique_ptr<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
       super___uniq_ptr_impl<ArrowArray,_std::default_delete<ArrowArray>_>._M_t.
       super__Tuple_impl<0UL,_ArrowArray_*,_std::default_delete<ArrowArray>_>.
       super__Head_base<0UL,_ArrowArray_*,_false>._M_head_impl;
  ::std::unique_ptr<ArrowArray,_std::default_delete<ArrowArray>_>::~unique_ptr
            ((unique_ptr<ArrowArray,_std::default_delete<ArrowArray>_> *)&local_28);
  return _Var3._M_head_impl;
}

Assistant:

ArrowArray *ArrowAppender::FinalizeChild(const LogicalType &type, unique_ptr<ArrowAppendData> append_data_p) {
	auto result = make_uniq<ArrowArray>();

	auto &append_data = *append_data_p;
	result->private_data = append_data_p.release();
	result->release = ReleaseArray;
	result->n_children = 0;
	result->null_count = 0;
	result->offset = 0;
	result->dictionary = nullptr;
	result->buffers = append_data.buffers.data();
	result->null_count = NumericCast<int64_t>(append_data.null_count);
	result->length = NumericCast<int64_t>(append_data.row_count);
	result->buffers[0] = append_data.GetValidityBuffer().data();

	if (append_data.finalize) {
		append_data.finalize(append_data, type, result.get());
	}

	append_data.array = std::move(result);
	return append_data.array.get();
}